

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

ColorRole __thiscall QWidget::backgroundRole(QWidget *this)

{
  bool bVar1;
  ColorRole CVar2;
  ColorRole CVar3;
  WindowType WVar4;
  QWidgetPrivate *pQVar5;
  QWidget *pQVar6;
  ColorRole role;
  QWidget *w;
  undefined4 in_stack_ffffffffffffffe0;
  
  do {
    pQVar5 = d_func((QWidget *)0x366941);
    CVar2 = *(uint *)&pQVar5->field_0x250 >> 8;
    CVar3 = CVar2 & 0xff;
    if (CVar3 != NoRole) {
      return CVar3;
    }
    bVar1 = isWindow((QWidget *)(CONCAT44(CVar2,in_stack_ffffffffffffffe0) & 0xffffffffff));
  } while (((!bVar1) &&
           (WVar4 = windowType((QWidget *)CONCAT44(CVar3,in_stack_ffffffffffffffe0)),
           WVar4 != SubWindow)) &&
          (pQVar6 = parentWidget((QWidget *)0x36698d), pQVar6 != (QWidget *)0x0));
  return Window;
}

Assistant:

QPalette::ColorRole QWidget::backgroundRole() const
{

    const QWidget *w = this;
    do {
        QPalette::ColorRole role = w->d_func()->bg_role;
        if (role != QPalette::NoRole)
            return role;
        if (w->isWindow() || w->windowType() == Qt::SubWindow)
            break;
        w = w->parentWidget();
    } while (w);
    return QPalette::Window;
}